

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::PatchableRootProperty
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint cacheId,bool isLoadMethod,bool isStore,
          bool registerCacheIdForCall)

{
  code *pcVar1;
  CacheIdUnit this_00;
  bool bVar2;
  undefined4 *puVar3;
  Phase tag;
  CacheIdUnit local_50;
  CacheIdUnit unit;
  RegSlot local_38;
  OpCode local_32 [4];
  OpCode op_local;
  
  local_32[0] = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x38);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  unit = (CacheIdUnit)this;
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x773,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_007ceae2;
    *puVar3 = 0;
  }
  if (isLoadMethod && isStore) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x774,"(!isLoadMethod || !isStore)","!isLoadMethod || !isStore");
    if (!bVar2) goto LAB_007ceae2;
    *puVar3 = 0;
  }
  this_00 = unit;
  local_38 = ConsumeReg((ByteCodeWriter *)unit,value);
  if ((op != InitRootLetFld) && (op != InitRootConstFld)) {
    if (op == LdRootFldForTypeOf) {
LAB_007ce899:
      bVar2 = DoDynamicProfileOpcode((ByteCodeWriter *)this_00,AggressiveIntTypeSpecPhase,false);
      if (!bVar2) {
        bVar2 = DoDynamicProfileOpcode((ByteCodeWriter *)this_00,FloatTypeSpecPhase,false);
        if (!bVar2) {
          bVar2 = DoDynamicProfileOpcode((ByteCodeWriter *)this_00,ObjTypeSpecPhase,false);
          if (!bVar2) {
            bVar2 = DoDynamicProfileOpcode((ByteCodeWriter *)this_00,InlinePhase,false);
            if (!bVar2) {
              tag = ProfileBasedFldFastPathPhase;
              goto LAB_007cea0e;
            }
          }
        }
      }
    }
    else {
      if (op == LdRootMethodFld) {
        if (registerCacheIdForCall) {
          local_50.isRootObjectCache = true;
          local_50.cacheId = cacheId;
          bVar2 = JsUtil::
                  BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::TryGetValue<unsigned_int>
                            (*(BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                               **)((long)this_00 + 0x118),&local_38,&local_50);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar3 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                        ,0x789,
                                        "(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit))",
                                        "!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit)");
            if (!bVar2) goto LAB_007ceae2;
            *puVar3 = 0;
          }
          JsUtil::
          BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    (*(BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                       **)((long)this_00 + 0x118),&local_38,&local_50);
        }
      }
      else if (((op != StRootFld) && (op != StRootFldStrict)) && (op != InitRootFld)) {
        if (op != LdRootFld) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x79a,"(false)",
                                      "The specified OpCode is not intended for patchable root field-access"
                                     );
          if (!bVar2) goto LAB_007ceae2;
          *puVar3 = 0;
          goto LAB_007cea22;
        }
        goto LAB_007ce899;
      }
      bVar2 = DoDynamicProfileOpcode((ByteCodeWriter *)this_00,ProfileBasedFldFastPathPhase,false);
      if (!bVar2) {
        bVar2 = DoDynamicProfileOpcode((ByteCodeWriter *)this_00,InlinePhase,false);
        if (!bVar2) {
          tag = ObjTypeSpecPhase;
LAB_007cea0e:
          bVar2 = DoDynamicProfileOpcode((ByteCodeWriter *)this_00,tag,false);
          if (!bVar2) goto LAB_007cea22;
        }
      }
    }
    OpCodeUtil::ConvertNonCallOpToProfiled(local_32);
  }
LAB_007cea22:
  bVar2 = TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    ((ByteCodeWriter *)this_00,local_32[0],local_38,cacheId,isLoadMethod,isStore);
  if (!bVar2) {
    bVar2 = TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      ((ByteCodeWriter *)this_00,local_32[0],local_38,cacheId,isLoadMethod,isStore);
    if (!bVar2) {
      bVar2 = TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        ((ByteCodeWriter *)this_00,local_32[0],local_38,cacheId,isLoadMethod,isStore
                        );
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x79e,"(success)","success");
        if (!bVar2) {
LAB_007ceae2:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::PatchableRootProperty(OpCode op, RegSlot value, uint cacheId, bool isLoadMethod, bool isStore, bool registerCacheIdForCall)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementRootCP);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        Assert(!isLoadMethod || !isStore);

        value = ConsumeReg(value);

        switch (op)
        {
        case OpCode::LdRootFld:
        case OpCode::LdRootFldForTypeOf:
            if (DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
                DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::LdRootMethodFld:
            if (registerCacheIdForCall)
            {
                CacheIdUnit unit(cacheId, true);
                Assert(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit));
                callRegToLdFldCacheIndexMap->Add(value, unit);
            }
        case OpCode::StRootFld:
        case OpCode::StRootFldStrict:
        case OpCode::InitRootFld:
            if (DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::InitRootLetFld:
        case OpCode::InitRootConstFld:
            break;
        default:
            AssertMsg(false, "The specified OpCode is not intended for patchable root field-access");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementRootCP, op, value, cacheId, isLoadMethod, isStore);
    }